

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitsphere.cpp
# Opt level: O2

float computeBoundingSphere(uint vcount,float *points,float *center)

{
  bool bVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [64];
  float fVar24;
  undefined1 auVar25 [64];
  float fVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  float fVar29;
  undefined1 auVar30 [64];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  int iVar36;
  
  auVar23 = ZEXT464(0xccbebc20);
  auVar25 = ZEXT464(0x4cbebc20);
  uVar3 = (ulong)vcount * 3;
  auVar9 = auVar25._0_16_;
  auVar27 = ZEXT1664(auVar9);
  auVar10 = auVar23._0_16_;
  auVar28 = ZEXT1664(auVar10);
  auVar30 = ZEXT1664(auVar10);
  auVar34 = ZEXT1664(auVar9);
  auVar35 = ZEXT1664(auVar9);
  auVar11 = auVar9;
  auVar12 = auVar9;
  auVar13 = auVar10;
  auVar14 = auVar10;
  auVar8 = auVar10;
  auVar6 = auVar10;
  auVar7 = auVar10;
  auVar32 = auVar9;
  auVar33 = auVar9;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 3) {
    uVar5 = uVar4 & 0xffffffff;
    auVar32 = vucomiss_avx512f(ZEXT416((uint)points[uVar5]));
    if (uVar4 < uVar3) {
      auVar27 = ZEXT464((uint)points[uVar5 + 1]);
      auVar25 = ZEXT464((uint)points[uVar5 + 2]);
      auVar32 = ZEXT416((uint)points[uVar5]);
    }
    auVar9 = vucomiss_avx512f(auVar30._0_16_);
    auVar15 = ZEXT416((uint)points[uVar5 + 1]);
    if (uVar4 < uVar3) {
      auVar23 = ZEXT464((uint)points[uVar5 + 2]);
      auVar28 = ZEXT1664(auVar15);
      auVar30 = ZEXT1664(auVar9);
    }
    auVar33 = vucomiss_avx512f(auVar15);
    if (uVar4 < uVar3) {
      auVar34 = ZEXT464((uint)points[uVar5 + 2]);
      auVar35 = ZEXT1664(auVar9);
      auVar33 = auVar15;
    }
    fVar29 = points[uVar5 + 2];
    auVar15 = vucomiss_avx512f(auVar6);
    auVar6 = vmaxss_avx512f(auVar15,auVar6);
    bVar1 = uVar4 < uVar3;
    iVar36 = auVar9._0_4_;
    auVar7._0_4_ = (uint)bVar1 * iVar36 + (uint)!bVar1 * auVar7._0_4_;
    auVar9 = vucomiss_avx512f(ZEXT416((uint)fVar29));
    auVar8._0_4_ = (uint)bVar1 * (int)fVar29 + (uint)!bVar1 * auVar8._0_4_;
    auVar9 = vminss_avx512f(ZEXT416((uint)fVar29),auVar9);
    bVar1 = uVar4 < uVar3;
    auVar16 = vucomiss_avx512f(auVar10);
    auVar10 = vmaxss_avx512f(auVar16,auVar10);
    auVar11._0_4_ = (uint)bVar1 * auVar15._0_4_ + (uint)!bVar1 * (int)auVar11._0_4_;
    auVar12._0_4_ = (uint)bVar1 * iVar36 + (uint)!bVar1 * auVar12._0_4_;
    bVar1 = uVar4 < uVar3;
    auVar13._0_4_ = (uint)bVar1 * auVar15._0_4_ + (uint)!bVar1 * (int)auVar13._0_4_;
    auVar14._0_4_ = (uint)bVar1 * iVar36 + (uint)!bVar1 * (int)auVar14._0_4_;
  }
  auVar15 = vsubss_avx512f(auVar28._0_16_,auVar27._0_16_);
  auVar16 = vsubss_avx512f(auVar30._0_16_,auVar32);
  auVar17 = vsubss_avx512f(auVar23._0_16_,auVar25._0_16_);
  auVar18 = vsubss_avx512f(auVar8,auVar34._0_16_);
  auVar19 = vsubss_avx512f(auVar14,auVar12);
  auVar20 = vsubss_avx512f(auVar10,auVar9);
  auVar15 = vmulss_avx512f(auVar15,auVar15);
  auVar15 = vfmadd231ss_avx512f(auVar15,auVar16,auVar16);
  auVar21 = vsubss_avx512f(auVar7,auVar35._0_16_);
  auVar16 = vfmadd231ss_avx512f(auVar15,auVar17,auVar17);
  auVar15 = vsubss_avx512f(auVar6,auVar33);
  auVar15 = vmulss_avx512f(auVar15,auVar15);
  auVar15 = vfmadd231ss_avx512f(auVar15,auVar21,auVar21);
  auVar17 = vsubss_avx512f(auVar13,auVar11);
  auVar17 = vmulss_avx512f(auVar17,auVar17);
  vfmadd231ss_avx512f(auVar15,auVar18,auVar18);
  auVar17 = vfmadd231ss_avx512f(auVar17,auVar19,auVar19);
  auVar15 = vucomiss_avx512f(auVar16);
  vfmadd231ss_avx512f(auVar17,auVar20,auVar20);
  if (uVar4 < uVar3) {
    auVar25 = ZEXT1664(auVar34._0_16_);
    auVar27 = ZEXT1664(auVar33);
    auVar23 = ZEXT1664(auVar8);
    auVar28 = ZEXT1664(auVar6);
    auVar30 = ZEXT1664(auVar7);
    auVar16 = auVar15;
    auVar32 = auVar35._0_16_;
  }
  fVar24 = auVar25._0_4_;
  fVar22 = auVar23._0_4_;
  vucomiss_avx512f(auVar16);
  fVar29 = auVar30._0_4_;
  fVar26 = auVar27._0_4_;
  fVar31 = auVar28._0_4_;
  if (uVar4 < uVar3) {
    fVar24 = auVar9._0_4_;
    fVar22 = auVar10._0_4_;
    auVar32 = auVar12;
    fVar29 = auVar14._0_4_;
    fVar26 = auVar11._0_4_;
    fVar31 = auVar13._0_4_;
  }
  uVar4 = 0;
  fVar26 = (fVar26 + fVar31) * 0.5;
  auVar27 = ZEXT464((uint)fVar26);
  fVar2 = (auVar32._0_4_ + fVar29) * 0.5;
  auVar30 = ZEXT464((uint)fVar2);
  fVar24 = (fVar24 + fVar22) * 0.5;
  auVar25 = ZEXT464((uint)fVar24);
  *center = fVar2;
  center[1] = fVar26;
  center[2] = fVar24;
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)((fVar31 - fVar26) * (fVar31 - fVar26))),
                            ZEXT416((uint)(fVar29 - fVar2)),ZEXT416((uint)(fVar29 - fVar2)));
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)(fVar22 - fVar24)),
                            ZEXT416((uint)(fVar22 - fVar24)));
  auVar28 = ZEXT1664(auVar32);
  auVar32 = vsqrtss_avx(auVar32,auVar32);
  auVar23 = ZEXT1664(auVar32);
  for (; uVar3 != uVar4; uVar4 = uVar4 + 3) {
    uVar5 = uVar4 & 0xffffffff;
    fVar29 = points[uVar5 + 1] - auVar27._0_4_;
    auVar32 = ZEXT416((uint)(points[uVar5] - auVar30._0_4_));
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),auVar32,auVar32);
    auVar33 = ZEXT416((uint)(points[uVar5 + 2] - auVar25._0_4_));
    auVar32 = vfmadd231ss_fma(auVar32,auVar33,auVar33);
    if (auVar28._0_4_ < auVar32._0_4_) {
      auVar32 = vsqrtss_avx(auVar32,auVar32);
      fVar31 = auVar32._0_4_;
      fVar29 = (fVar31 + auVar23._0_4_) * 0.5;
      auVar23 = ZEXT464((uint)fVar29);
      fVar26 = fVar31 - fVar29;
      fVar31 = 1.0 / fVar31;
      auVar28 = ZEXT464((uint)(fVar29 * fVar29));
      auVar9 = ZEXT416((uint)fVar29);
      auVar32 = vfmadd213ss_fma(auVar30._0_16_,auVar9,ZEXT416((uint)(fVar26 * points[uVar5])));
      auVar33 = vfmadd213ss_fma(auVar27._0_16_,auVar9,ZEXT416((uint)(fVar26 * points[uVar5 + 1])));
      auVar9 = vfmadd213ss_fma(auVar25._0_16_,auVar9,ZEXT416((uint)(fVar26 * points[uVar5 + 2])));
      fVar29 = fVar31 * auVar32._0_4_;
      auVar30 = ZEXT464((uint)fVar29);
      fVar26 = fVar31 * auVar33._0_4_;
      auVar27 = ZEXT464((uint)fVar26);
      fVar31 = fVar31 * auVar9._0_4_;
      auVar25 = ZEXT464((uint)fVar31);
      *center = fVar29;
      center[1] = fVar26;
      center[2] = fVar31;
    }
  }
  return auVar23._0_4_;
}

Assistant:

float computeBoundingSphere(unsigned int vcount,const float *points,float *center)
{

  float mRadius;
  float mRadius2;

	float xmin[3];
	float xmax[3];
	float ymin[3];
	float ymax[3];
	float zmin[3];
	float zmax[3];
	float dia1[3];
	float dia2[3];

  /* FIRST PASS: find 6 minima/maxima points */
  Set(xmin,BIGNUMBER,BIGNUMBER,BIGNUMBER);
  Set(xmax,-BIGNUMBER,-BIGNUMBER,-BIGNUMBER);
  Set(ymin,BIGNUMBER,BIGNUMBER,BIGNUMBER);
  Set(ymax,-BIGNUMBER,-BIGNUMBER,-BIGNUMBER);
  Set(zmin,BIGNUMBER,BIGNUMBER,BIGNUMBER);
  Set(zmax,-BIGNUMBER,-BIGNUMBER,-BIGNUMBER);

  for (unsigned i=0; i<vcount; i++)
	{
		const float *caller_p = &points[i*3];

   	if (caller_p[0]<xmin[0])
  	  Copy(xmin,caller_p); /* New xminimum point */
  	if (caller_p[0]>xmax[0])
  	  Copy(xmax,caller_p);
  	if (caller_p[1]<ymin[1])
  	  Copy(ymin,caller_p);
  	if (caller_p[1]>ymax[1])
  	  Copy(ymax,caller_p);
  	if (caller_p[2]<zmin[2])
  	  Copy(zmin,caller_p);
  	if (caller_p[2]>zmax[2])
  	  Copy(zmax,caller_p);
	}

  /* Set xspan = distance between the 2 points xmin & xmax (squared) */
  float dx = xmax[0] - xmin[0];
  float dy = xmax[1] - xmin[1];
  float dz = xmax[2] - xmin[2];
  float xspan = dx*dx + dy*dy + dz*dz;

  /* Same for y & z spans */
  dx = ymax[0] - ymin[0];
  dy = ymax[1] - ymin[1];
  dz = ymax[2] - ymin[2];
  float yspan = dx*dx + dy*dy + dz*dz;

  dx = zmax[0] - zmin[0];
  dy = zmax[1] - zmin[1];
  dz = zmax[2] - zmin[2];
  float zspan = dx*dx + dy*dy + dz*dz;

  /* Set points dia1 & dia2 to the maximally separated pair */
  Copy(dia1,xmin);
  Copy(dia2,xmax); /* assume xspan biggest */
  float maxspan = xspan;

  if (yspan>maxspan)
	{
	  maxspan = yspan;
  	Copy(dia1,ymin);
  	Copy(dia2,ymax);
	}

  if (zspan>maxspan)
	{
	  Copy(dia1,zmin);
	  Copy(dia2,zmax);
	}


  /* dia1,dia2 is a diameter of initial sphere */
  /* calc initial center */
  center[0] = (dia1[0]+dia2[0])*0.5f;
  center[1] = (dia1[1]+dia2[1])*0.5f;
  center[2] = (dia1[2]+dia2[2])*0.5f;

  /* calculate initial radius**2 and radius */

  dx = dia2[0]-center[0]; /* x component of radius vector */
  dy = dia2[1]-center[1]; /* y component of radius vector */
  dz = dia2[2]-center[2]; /* z component of radius vector */

  mRadius2 = dx*dx + dy*dy + dz*dz;
  mRadius = float(sqrt(mRadius2));

  /* SECOND PASS: increment current sphere */

	if ( 1 )
	{
		for (unsigned i=0; i<vcount; i++)
		{
			const float *caller_p = &points[i*3];

  		dx = caller_p[0]-center[0];
			dy = caller_p[1]-center[1];
  		dz = caller_p[2]-center[2];

			float old_to_p_sq = dx*dx + dy*dy + dz*dz;

  		if (old_to_p_sq > mRadius2) 	/* do r**2 test first */
			{ 	/* this point is outside of current sphere */
	  		float old_to_p = float(sqrt(old_to_p_sq));
				/* calc radius of new sphere */
  			mRadius = (mRadius + old_to_p) * 0.5f;
	  		mRadius2 = mRadius*mRadius; 	/* for next r**2 compare */
  			float old_to_new = old_to_p - mRadius;

	  		/* calc center of new sphere */

				float recip = 1.0f /old_to_p;

  			float cx = (mRadius*center[0] + old_to_new*caller_p[0]) * recip;
	  		float cy = (mRadius*center[1] + old_to_new*caller_p[1]) * recip;
				float cz = (mRadius*center[2] + old_to_new*caller_p[2]) * recip;

				Set(center,cx,cy,cz);
			}
		}
	}

  return mRadius;
}